

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<int,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (longlong lhs,SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  int iVar2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *pSVar3;
  int *in_RDX;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  int tmp;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  
  this = in_RDI;
  pSVar3 = (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           std::numeric_limits<long_long>::min();
  if ((in_RDI == pSVar3) &&
     (iVar2 = ::SafeInt::operator_cast_to_int
                        ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)), iVar2 == -1
     )) {
    bVar1 = div_negate_min<int,_long_long,_false>::Value((int *)&stack0xffffffffffffffe4);
    if (bVar1) {
      SafeInt<int,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=(this,in_RDX);
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }